

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateInputCount
                   (Result *__return_storage_ptr__,NeuralNetworkLayer *layer,int min,int max)

{
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  uint __uval_1;
  uint uVar11;
  uint uVar12;
  uint __uval;
  uint uVar13;
  string __str;
  string __str_1;
  string err;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  long *local_178;
  undefined8 local_170;
  long local_168;
  undefined8 uStack_160;
  long *local_158;
  undefined8 local_150;
  long local_148;
  undefined8 uStack_140;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  Result *local_38;
  
  if (-1 < max && max < min) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0x62,
                  "Result CoreML::validateInputCount(const Specification::NeuralNetworkLayer &, int, int)"
                 );
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if ((max == min && 0 < max) && ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != min))
  {
    psVar1 = (layer->name_).ptr_;
    local_98[0] = local_88;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pcVar2,pcVar2 + psVar1->_M_string_length);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x318e03);
    local_b8 = &local_a8;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_a8 = *plVar4;
      lStack_a0 = puVar5[3];
    }
    else {
      local_a8 = *plVar4;
      local_b8 = (long *)*puVar5;
    }
    local_b0 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_1d8 = &local_1c8;
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_1c8 = *puVar9;
      lStack_1c0 = plVar4[3];
    }
    else {
      local_1c8 = *puVar9;
      local_1d8 = (ulong *)*plVar4;
    }
    local_1d0 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar11 = layer->_oneof_case_[0];
    uVar13 = -uVar11;
    if (0 < (int)uVar11) {
      uVar13 = uVar11;
    }
    uVar12 = 1;
    if (9 < uVar13) {
      uVar10 = (ulong)uVar13;
      uVar7 = 4;
      do {
        uVar12 = uVar7;
        uVar6 = (uint)uVar10;
        if (uVar6 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_002dda9d;
        }
        if (uVar6 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_002dda9d;
        }
        if (uVar6 < 10000) goto LAB_002dda9d;
        uVar10 = uVar10 / 10000;
        uVar7 = uVar12 + 4;
      } while (99999 < uVar6);
      uVar12 = uVar12 + 1;
    }
LAB_002dda9d:
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar12 - (char)((int)uVar11 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_1b8),uVar12,uVar13);
    uVar10 = 0xf;
    if (local_1d8 != &local_1c8) {
      uVar10 = local_1c8;
    }
    if (uVar10 < (ulong)(local_1b0 + local_1d0)) {
      uVar10 = 0xf;
      if (local_1b8 != local_1a8) {
        uVar10 = local_1a8[0];
      }
      if (uVar10 < (ulong)(local_1b0 + local_1d0)) goto LAB_002ddb18;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1d8);
    }
    else {
LAB_002ddb18:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8);
    }
    local_178 = &local_168;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_168 = *plVar4;
      uStack_160 = puVar5[3];
    }
    else {
      local_168 = *plVar4;
      local_178 = (long *)*puVar5;
    }
    local_170 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    local_38 = __return_storage_ptr__;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_108 = *puVar9;
      lStack_100 = plVar4[3];
      local_118 = &local_108;
    }
    else {
      local_108 = *puVar9;
      local_118 = (ulong *)*plVar4;
    }
    local_110 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar11 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
    uVar13 = -uVar11;
    if (0 < (int)uVar11) {
      uVar13 = uVar11;
    }
    uVar12 = 1;
    if (9 < uVar13) {
      uVar10 = (ulong)uVar13;
      uVar7 = 4;
      do {
        uVar12 = uVar7;
        uVar6 = (uint)uVar10;
        if (uVar6 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_002ddc42;
        }
        if (uVar6 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_002ddc42;
        }
        if (uVar6 < 10000) goto LAB_002ddc42;
        uVar10 = uVar10 / 10000;
        uVar7 = uVar12 + 4;
      } while (99999 < uVar6);
      uVar12 = uVar12 + 1;
    }
LAB_002ddc42:
    local_198 = local_188;
    std::__cxx11::string::_M_construct((ulong)&local_198,(char)uVar12 - (char)((int)uVar11 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_198),uVar12,uVar13);
    uVar10 = 0xf;
    if (local_118 != &local_108) {
      uVar10 = local_108;
    }
    if (uVar10 < (ulong)(local_190 + local_110)) {
      uVar10 = 0xf;
      if (local_198 != local_188) {
        uVar10 = local_188[0];
      }
      if (uVar10 < (ulong)(local_190 + local_110)) goto LAB_002ddcbd;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_118);
    }
    else {
LAB_002ddcbd:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_198);
    }
    local_158 = &local_148;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_148 = *plVar4;
      uStack_140 = puVar5[3];
    }
    else {
      local_148 = *plVar4;
      local_158 = (long *)*puVar5;
    }
    local_150 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_e8 = *puVar9;
      lStack_e0 = plVar4[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar9;
      local_f8 = (ulong *)*plVar4;
    }
    local_f0 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar11 = -min;
    if (0 < min) {
      uVar11 = min;
    }
    uVar13 = 1;
    if (9 < uVar11) {
      uVar10 = (ulong)uVar11;
      uVar12 = 4;
      do {
        uVar13 = uVar12;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_002dddf5;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_002dddf5;
        }
        if (uVar7 < 10000) goto LAB_002dddf5;
        uVar10 = uVar10 / 10000;
        uVar12 = uVar13 + 4;
      } while (99999 < uVar7);
      uVar13 = uVar13 + 1;
    }
LAB_002dddf5:
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar13 - (char)(min >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_d8 + (ulong)((uint)min >> 0x1f)),uVar13,uVar11);
    uVar10 = 0xf;
    if (local_f8 != &local_e8) {
      uVar10 = local_e8;
    }
    if (uVar10 < (ulong)(local_d0 + local_f0)) {
      uVar10 = 0xf;
      if (local_d8 != local_c8) {
        uVar10 = local_c8[0];
      }
      if (uVar10 < (ulong)(local_d0 + local_f0)) goto LAB_002dde82;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_002dde82:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8);
    }
    local_138 = &local_128;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_128 = *plVar4;
      uStack_120 = puVar5[3];
    }
    else {
      local_128 = *plVar4;
      local_138 = (long *)*puVar5;
    }
    local_130 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar8 = plVar4 + 2;
    if ((long *)*plVar4 == plVar8) {
      local_68 = *plVar8;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar8;
      local_78 = (long *)*plVar4;
    }
    local_70 = plVar4[1];
    *plVar4 = (long)plVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    __return_storage_ptr__ = local_38;
    if (local_178 != &local_168) {
LAB_002de05a:
      operator_delete(local_178,local_168 + 1);
    }
LAB_002de067:
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_98[0] != local_88) {
LAB_002de0d8:
      operator_delete(local_98[0],local_88[0] + 1);
    }
  }
  else {
    if ((0 < min) && ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < min)) {
      psVar1 = (layer->name_).ptr_;
      local_98[0] = local_88;
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar2,pcVar2 + psVar1->_M_string_length);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x318e03);
      local_b8 = &local_a8;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_a8 = *plVar8;
        lStack_a0 = plVar4[3];
      }
      else {
        local_a8 = *plVar8;
        local_b8 = (long *)*plVar4;
      }
      local_b0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
      local_1d8 = &local_1c8;
      puVar9 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar9) {
        local_1c8 = *puVar9;
        lStack_1c0 = puVar5[3];
      }
      else {
        local_1c8 = *puVar9;
        local_1d8 = (ulong *)*puVar5;
      }
      local_1d0 = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      uVar11 = layer->_oneof_case_[0];
      uVar13 = -uVar11;
      if (0 < (int)uVar11) {
        uVar13 = uVar11;
      }
      uVar12 = 1;
      if (9 < uVar13) {
        uVar10 = (ulong)uVar13;
        uVar7 = 4;
        do {
          uVar12 = uVar7;
          uVar6 = (uint)uVar10;
          if (uVar6 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_002de138;
          }
          if (uVar6 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_002de138;
          }
          if (uVar6 < 10000) goto LAB_002de138;
          uVar10 = uVar10 / 10000;
          uVar7 = uVar12 + 4;
        } while (99999 < uVar6);
        uVar12 = uVar12 + 1;
      }
LAB_002de138:
      local_1b8 = local_1a8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_1b8,(char)uVar12 - (char)((int)uVar11 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_1b8),uVar12,uVar13);
      uVar10 = 0xf;
      if (local_1d8 != &local_1c8) {
        uVar10 = local_1c8;
      }
      if (uVar10 < (ulong)(local_1b0 + local_1d0)) {
        uVar10 = 0xf;
        if (local_1b8 != local_1a8) {
          uVar10 = local_1a8[0];
        }
        if (uVar10 < (ulong)(local_1b0 + local_1d0)) goto LAB_002de1b3;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1d8);
      }
      else {
LAB_002de1b3:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8);
      }
      local_178 = &local_168;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_168 = *plVar4;
        uStack_160 = puVar5[3];
      }
      else {
        local_168 = *plVar4;
        local_178 = (long *)*puVar5;
      }
      local_170 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar9) {
        local_108 = *puVar9;
        lStack_100 = plVar4[3];
        local_118 = &local_108;
      }
      else {
        local_108 = *puVar9;
        local_118 = (ulong *)*plVar4;
      }
      local_110 = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar11 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
      uVar13 = -uVar11;
      if (0 < (int)uVar11) {
        uVar13 = uVar11;
      }
      uVar12 = 1;
      if (9 < uVar13) {
        uVar10 = (ulong)uVar13;
        uVar7 = 4;
        do {
          uVar12 = uVar7;
          uVar6 = (uint)uVar10;
          if (uVar6 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_002de2d7;
          }
          if (uVar6 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_002de2d7;
          }
          if (uVar6 < 10000) goto LAB_002de2d7;
          uVar10 = uVar10 / 10000;
          uVar7 = uVar12 + 4;
        } while (99999 < uVar6);
        uVar12 = uVar12 + 1;
      }
LAB_002de2d7:
      local_198 = local_188;
      std::__cxx11::string::_M_construct
                ((ulong)&local_198,(char)uVar12 - (char)((int)uVar11 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_198),uVar12,uVar13);
      uVar10 = 0xf;
      if (local_118 != &local_108) {
        uVar10 = local_108;
      }
      if (uVar10 < (ulong)(local_190 + local_110)) {
        uVar10 = 0xf;
        if (local_198 != local_188) {
          uVar10 = local_188[0];
        }
        if (uVar10 < (ulong)(local_190 + local_110)) goto LAB_002de357;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_118);
      }
      else {
LAB_002de357:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_198);
      }
      local_158 = &local_148;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_148 = *plVar4;
        uStack_140 = puVar5[3];
      }
      else {
        local_148 = *plVar4;
        local_158 = (long *)*puVar5;
      }
      local_150 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar9) {
        local_e8 = *puVar9;
        lStack_e0 = plVar4[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *puVar9;
        local_f8 = (ulong *)*plVar4;
      }
      local_f0 = plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar11 = 1;
      if (9 < (uint)min) {
        uVar13 = min;
        uVar12 = 4;
        do {
          uVar11 = uVar12;
          if (uVar13 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_002de47d;
          }
          if (uVar13 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_002de47d;
          }
          if (uVar13 < 10000) goto LAB_002de47d;
          bVar3 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          uVar12 = uVar11 + 4;
        } while (bVar3);
        uVar11 = uVar11 + 1;
      }
LAB_002de47d:
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar11);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,uVar11,min);
      uVar10 = 0xf;
      if (local_f8 != &local_e8) {
        uVar10 = local_e8;
      }
      if (uVar10 < (ulong)(local_d0 + local_f0)) {
        uVar10 = 0xf;
        if (local_d8 != local_c8) {
          uVar10 = local_c8[0];
        }
        if (uVar10 < (ulong)(local_d0 + local_f0)) goto LAB_002de502;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
      }
      else {
LAB_002de502:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8);
      }
      local_138 = &local_128;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_128 = *plVar4;
        uStack_120 = puVar5[3];
      }
      else {
        local_128 = *plVar4;
        local_138 = (long *)*puVar5;
      }
      local_130 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_68 = *plVar8;
        lStack_60 = plVar4[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar8;
        local_78 = (long *)*plVar4;
      }
      local_70 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,local_148 + 1);
      }
      if (local_198 != local_188) {
        operator_delete(local_198,local_188[0] + 1);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118,local_108 + 1);
      }
      if (local_178 != &local_168) goto LAB_002de05a;
      goto LAB_002de067;
    }
    if ((max < 1) || ((layer->input_).super_RepeatedPtrFieldBase.current_size_ <= max)) {
      Result::Result(__return_storage_ptr__);
      goto LAB_002de0fd;
    }
    psVar1 = (layer->name_).ptr_;
    local_98[0] = local_88;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pcVar2,pcVar2 + psVar1->_M_string_length);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x318e03);
    local_b8 = &local_a8;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_a8 = *plVar4;
      lStack_a0 = puVar5[3];
    }
    else {
      local_a8 = *plVar4;
      local_b8 = (long *)*puVar5;
    }
    local_b0 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    local_1d8 = &local_1c8;
    puVar9 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar9) {
      local_1c8 = *puVar9;
      lStack_1c0 = puVar5[3];
    }
    else {
      local_1c8 = *puVar9;
      local_1d8 = (ulong *)*puVar5;
    }
    local_1d0 = puVar5[1];
    *puVar5 = puVar9;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    uVar11 = layer->_oneof_case_[0];
    uVar13 = -uVar11;
    if (0 < (int)uVar11) {
      uVar13 = uVar11;
    }
    uVar12 = 1;
    if (9 < uVar13) {
      uVar10 = (ulong)uVar13;
      uVar7 = 4;
      do {
        uVar12 = uVar7;
        uVar6 = (uint)uVar10;
        if (uVar6 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_002de6e4;
        }
        if (uVar6 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_002de6e4;
        }
        if (uVar6 < 10000) goto LAB_002de6e4;
        uVar10 = uVar10 / 10000;
        uVar7 = uVar12 + 4;
      } while (99999 < uVar6);
      uVar12 = uVar12 + 1;
    }
LAB_002de6e4:
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar12 - (char)((int)uVar11 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_1b8),uVar12,uVar13);
    uVar10 = 0xf;
    if (local_1d8 != &local_1c8) {
      uVar10 = local_1c8;
    }
    if (uVar10 < (ulong)(local_1b0 + local_1d0)) {
      uVar10 = 0xf;
      if (local_1b8 != local_1a8) {
        uVar10 = local_1a8[0];
      }
      if (uVar10 < (ulong)(local_1b0 + local_1d0)) goto LAB_002de760;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1d8);
    }
    else {
LAB_002de760:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8);
    }
    local_178 = &local_168;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_168 = *plVar4;
      uStack_160 = puVar5[3];
    }
    else {
      local_168 = *plVar4;
      local_178 = (long *)*puVar5;
    }
    local_170 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_178);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_108 = *puVar9;
      lStack_100 = plVar4[3];
      local_118 = &local_108;
    }
    else {
      local_108 = *puVar9;
      local_118 = (ulong *)*plVar4;
    }
    local_110 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar11 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
    uVar13 = -uVar11;
    if (0 < (int)uVar11) {
      uVar13 = uVar11;
    }
    uVar12 = 1;
    if (9 < uVar13) {
      uVar10 = (ulong)uVar13;
      uVar7 = 4;
      do {
        uVar12 = uVar7;
        uVar6 = (uint)uVar10;
        if (uVar6 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_002de887;
        }
        if (uVar6 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_002de887;
        }
        if (uVar6 < 10000) goto LAB_002de887;
        uVar10 = uVar10 / 10000;
        uVar7 = uVar12 + 4;
      } while (99999 < uVar6);
      uVar12 = uVar12 + 1;
    }
LAB_002de887:
    local_198 = local_188;
    std::__cxx11::string::_M_construct((ulong)&local_198,(char)uVar12 - (char)((int)uVar11 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar11 >> 0x1f) + (long)local_198),uVar12,uVar13);
    uVar10 = 0xf;
    if (local_118 != &local_108) {
      uVar10 = local_108;
    }
    if (uVar10 < (ulong)(local_190 + local_110)) {
      uVar10 = 0xf;
      if (local_198 != local_188) {
        uVar10 = local_188[0];
      }
      if (uVar10 < (ulong)(local_190 + local_110)) goto LAB_002de908;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_118);
    }
    else {
LAB_002de908:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_198);
    }
    local_158 = &local_148;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_148 = *plVar4;
      uStack_140 = puVar5[3];
    }
    else {
      local_148 = *plVar4;
      local_158 = (long *)*puVar5;
    }
    local_150 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_158);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_e8 = *puVar9;
      lStack_e0 = plVar4[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar9;
      local_f8 = (ulong *)*plVar4;
    }
    local_f0 = plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar11 = 1;
    if (9 < (uint)max) {
      uVar13 = max;
      uVar12 = 4;
      do {
        uVar11 = uVar12;
        if (uVar13 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_002dea32;
        }
        if (uVar13 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_002dea32;
        }
        if (uVar13 < 10000) goto LAB_002dea32;
        bVar3 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        uVar12 = uVar11 + 4;
      } while (bVar3);
      uVar11 = uVar11 + 1;
    }
LAB_002dea32:
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar11);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_d8,uVar11,max);
    uVar10 = 0xf;
    if (local_f8 != &local_e8) {
      uVar10 = local_e8;
    }
    if (uVar10 < (ulong)(local_d0 + local_f0)) {
      uVar10 = 0xf;
      if (local_d8 != local_c8) {
        uVar10 = local_c8[0];
      }
      if (uVar10 < (ulong)(local_d0 + local_f0)) goto LAB_002deab8;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_002deab8:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8);
    }
    local_138 = &local_128;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_128 = *plVar4;
      uStack_120 = puVar5[3];
    }
    else {
      local_128 = *plVar4;
      local_138 = (long *)*puVar5;
    }
    local_130 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar8 = plVar4 + 2;
    if ((long *)*plVar4 == plVar8) {
      local_68 = *plVar8;
      lStack_60 = plVar4[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar8;
      local_78 = (long *)*plVar4;
    }
    local_70 = plVar4[1];
    *plVar4 = (long)plVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_198 != local_188) {
      operator_delete(local_198,local_188[0] + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_98[0] != local_88) goto LAB_002de0d8;
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
LAB_002de0fd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateInputCount(const Specification::NeuralNetworkLayer& layer, int min, int max) {
    
    assert( min <= max || max < 0 );
    std::string err;
    
    if (max > 0 && max == min && layer.input_size() != max) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + " has " + std::to_string(layer.input_size()) + " inputs but expects exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && layer.input_size() < min) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.input_size()) + " inputs but expects at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && layer.input_size() > max) {
        err = "Layer '" + std::string(layer.name()) + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.input_size()) + " inputs but expects at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else {
        return Result();
    }
}